

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

string * wasm::Path::getBinaryenRoot_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  
  __s = getenv("BINARYEN_ROOT");
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (__s != (char *)0x0) {
    strlen(__s);
  }
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string getBinaryenRoot() {
  auto* envVar = getenv("BINARYEN_ROOT");
  if (envVar) {
    return envVar;
  }
  return ".";
}